

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O1

void __thiscall CentralBroker::~CentralBroker(CentralBroker *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  if (this->initialized == true) {
    zactor_destroy(&this->logger);
  }
  if (this->brokerHandle != (BrokerClient *)0x0) {
    (*(this->brokerHandle->super_MlmWrap)._vptr_MlmWrap[1])();
  }
  zactor_destroy(&this->broker);
  zsys_shutdown();
  pcVar1 = (this->address)._M_dataplus._M_p;
  paVar2 = &(this->address).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->endpoint)._M_dataplus._M_p;
  paVar2 = &(this->endpoint).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

CentralBroker::~CentralBroker() {
    if(initialized){
        zactor_destroy(&logger);
    }
    delete brokerHandle;
    zactor_destroy(&broker);
    zsys_shutdown();
}